

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

void idwpt_per(wpt_object wt,double *cA,int len_cA,double *cD,double *X)

{
  wave_object pwVar1;
  double *pdVar2;
  int iVar3;
  double *pdVar4;
  ulong uVar5;
  uint uVar6;
  long lVar8;
  uint uVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar7;
  
  pwVar1 = wt->wave;
  iVar3 = pwVar1->hpr_len + pwVar1->lpr_len;
  iVar7 = pwVar1->hpr_len + pwVar1->lpr_len + 3;
  if (-1 < iVar3) {
    iVar7 = iVar3;
  }
  uVar6 = iVar7 >> 2;
  uVar9 = (len_cA + uVar6) - 1;
  if (0 < (int)uVar9) {
    iVar7 = len_cA + iVar3 / 2;
    lVar11 = (long)len_cA;
    lVar15 = -1;
    lVar14 = -2;
    uVar5 = 0;
    do {
      X[lVar14 + 2] = 0.0;
      lVar14 = lVar14 + 2;
      X[lVar15 + 2] = 0.0;
      lVar15 = lVar15 + 2;
      if (3 < iVar3) {
        lVar16 = 0;
        lVar8 = 0;
        lVar12 = 0;
        do {
          lVar13 = uVar5 + lVar8;
          if (lVar13 < lVar11 && -1 < lVar13) {
            pdVar4 = pwVar1->lpr;
            pdVar10 = (double *)((long)pdVar4 + lVar16);
LAB_00106a85:
            pdVar2 = pwVar1->hpr;
            X[lVar14] = *pdVar10 * cA[lVar13] + *(double *)((long)pdVar2 + lVar16) * cD[lVar13] +
                        X[lVar14];
            X[lVar15] = *(double *)((long)pdVar4 + lVar16 + 8) * cA[lVar13] +
                        *(double *)((long)pdVar2 + lVar16 + 8) * cD[lVar13] + X[lVar15];
          }
          else {
            if (lVar13 < iVar7 + -1 && lVar11 <= lVar13) {
              pdVar4 = pwVar1->lpr;
              pdVar10 = pdVar4 + lVar12 * 2;
              lVar13 = (uVar5 - lVar12) - lVar11;
              goto LAB_00106a85;
            }
            if ((lVar13 < 0) && ((int)-uVar6 < lVar13)) {
              pdVar4 = pwVar1->lpr;
              pdVar10 = pdVar4 + lVar12 * 2;
              lVar13 = (long)(len_cA + (int)lVar8);
              goto LAB_00106a85;
            }
          }
          lVar12 = lVar12 + 1;
          lVar8 = lVar8 + -1;
          lVar16 = lVar16 + 0x10;
        } while (-(ulong)uVar6 != lVar8);
      }
      uVar5 = uVar5 + 1;
      len_cA = len_cA + 1;
    } while (uVar5 != uVar9);
  }
  return;
}

Assistant:

static void idwpt_per(wpt_object wt, double *cA, int len_cA, double *cD, double *X) {
	int len_avg, i, l, m, n, t, l2;

	len_avg = (wt->wave->lpr_len + wt->wave->hpr_len) / 2;
	l2 = len_avg / 2;
	m = -2;
	n = -1;

	for (i = 0; i < len_cA + l2 - 1; ++i) {
		m += 2;
		n += 2;
		X[m] = 0.0;
		X[n] = 0.0;
		for (l = 0; l < l2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				X[m] += wt->wave->lpr[t] * cA[i - l] + wt->wave->hpr[t] * cD[i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l] + wt->wave->hpr[t + 1] * cD[i - l];
			}
			else if ((i - l) >= len_cA && (i - l) < len_cA + len_avg - 1) {
				X[m] += wt->wave->lpr[t] * cA[i - l - len_cA] + wt->wave->hpr[t] * cD[i - l - len_cA];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l - len_cA] + wt->wave->hpr[t + 1] * cD[i - l - len_cA];
			}
			else if ((i - l) < 0 && (i - l) > -l2) {
				X[m] += wt->wave->lpr[t] * cA[len_cA + i - l] + wt->wave->hpr[t] * cD[len_cA + i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[len_cA + i - l] + wt->wave->hpr[t + 1] * cD[len_cA + i - l];
			}
		}
	}
}